

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O2

void ExpressionStatement_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  JsVm *pJVar1;
  undefined1 local_40 [8];
  JsValue r1;
  
  res_00 = (JsValue *)JsMalloc(0x18);
  context->pc = na->location;
  pJVar1 = JsGetVm();
  if (pJVar1->debug == 1) {
    pJVar1 = JsGetVm();
    if (pJVar1->trace != (JsVmTraceFn)0x0) {
      pJVar1 = JsGetVm();
      (*pJVar1->trace)(context->engine,na->location,JS_TRACE_STATEMENT);
    }
  }
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_40);
  JsGetValue((JsValue *)local_40,res_00);
  res->type = JS_COMPLETION;
  (res->u).completion.type = JS_COMPLETION_NORMAL;
  (res->u).completion.value = res_00;
  return;
}

Assistant:

static void
ExpressionStatement_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1;
	struct JsValue *v = (struct JsValue*)JsMalloc(sizeof(struct JsValue));

	TRACE(na->location, context, JS_TRACE_STATEMENT);
	EVAL(n->a, context, &r1);
	JsGetValue(&r1, v);
	JS_SET_COMPLETION(res, JS_COMPLETION_NORMAL, v);
}